

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O2

int luaB_setfenv(lua_State *L)

{
  int iVar1;
  lua_Number lVar2;
  
  luaL_checktype(L,2,5);
  getfunc(L,0);
  lua_pushvalue(L,2);
  iVar1 = lua_isnumber(L,1);
  if (iVar1 != 0) {
    lVar2 = lua_tonumber(L,1);
    if ((lVar2 == 0.0) && (!NAN(lVar2))) {
      lua_pushthread(L);
      lua_insert(L,-2);
      lua_setfenv(L,-2);
      return 0;
    }
  }
  iVar1 = lua_iscfunction(L,-2);
  if ((iVar1 == 0) && (iVar1 = lua_setfenv(L,-2), iVar1 != 0)) {
    return 1;
  }
  luaL_error(L,"\'setfenv\' cannot change environment of given object");
  return 1;
}

Assistant:

static int luaB_setfenv (lua_State *L) {
  luaL_checktype(L, 2, LUA_TTABLE);
  getfunc(L, 0);
  lua_pushvalue(L, 2);
  if (lua_isnumber(L, 1) && lua_tonumber(L, 1) == 0) {
    /* change environment of current thread */
    lua_pushthread(L);
    lua_insert(L, -2);
    lua_setfenv(L, -2);
    return 0;
  }
  else if (lua_iscfunction(L, -2) || lua_setfenv(L, -2) == 0)
    luaL_error(L,
          LUA_QL("setfenv") " cannot change environment of given object");
  return 1;
}